

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

EdgeBool * __thiscall
indigox::utils::
Graph<indigox::PermVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::AddEdge
          (EdgeBool *__return_storage_ptr__,
          Graph<indigox::PermVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
          *this,boost *u,boost *v,
          adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config>_>
          *param_5,undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config>
                   *param_6)

{
  EdgeBool e;
  undefined1 local_69;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool> local_68;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool> local_48;
  
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>>
            (&local_68,u,v,
             (this->graph_).
             super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,param_5);
  if ((u == v) || (local_68.second == true)) {
    (__return_storage_ptr__->first).m_eproperty = local_68.first.m_eproperty;
    (__return_storage_ptr__->first).super_edge_base<boost::undirected_tag,_void_*>.m_source =
         local_68.first.super_edge_base<boost::undirected_tag,_void_*>.m_source;
    (__return_storage_ptr__->first).super_edge_base<boost::undirected_tag,_void_*>.m_target =
         local_68.first.super_edge_base<boost::undirected_tag,_void_*>.m_target;
    __return_storage_ptr__->second = false;
  }
  else {
    boost::
    add_edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>
              (&local_48,u,v,&local_69,
               (edge_property_type *)
               (this->graph_).
               super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,param_6);
    local_68.first.m_eproperty = local_48.first.m_eproperty;
    local_68.first.super_edge_base<boost::undirected_tag,_void_*>.m_source =
         (void *)CONCAT44(local_48.first.super_edge_base<boost::undirected_tag,_void_*>.m_source.
                          _4_4_,local_48.first.super_edge_base<boost::undirected_tag,_void_*>.
                                m_source._0_4_);
    local_68.first.super_edge_base<boost::undirected_tag,_void_*>.m_target =
         (void *)CONCAT44(local_48.first.super_edge_base<boost::undirected_tag,_void_*>.m_target.
                          _4_4_,local_48.first.super_edge_base<boost::undirected_tag,_void_*>.
                                m_target._0_4_);
    local_68.second = local_48.second;
    local_48._24_8_ = this->next_edge_id_;
    this->next_edge_id_ = local_48._24_8_ + 1;
    boost::multi_index::
    multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
    ::insert_<boost::multi_index::detail::lvalue_tag>
              ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                *)(*(ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                     **)((long)&(this->edge_idxmap_).super_relation_set.
                                super_set_adaptor<_c9ff9997_>.
                                super_ordered_associative_container_adaptor<_7d573cef_>.super_type.
                                super_type.dwfb + 8) + -8),&local_48);
    (__return_storage_ptr__->first).m_eproperty = local_68.first.m_eproperty;
    *(ulong *)&__return_storage_ptr__->second = CONCAT71(local_68._25_7_,local_68.second);
    (__return_storage_ptr__->first).super_edge_base<boost::undirected_tag,_void_*>.m_source =
         local_68.first.super_edge_base<boost::undirected_tag,_void_*>.m_source;
    (__return_storage_ptr__->first).super_edge_base<boost::undirected_tag,_void_*>.m_target =
         local_68.first.super_edge_base<boost::undirected_tag,_void_*>.m_target;
  }
  return __return_storage_ptr__;
}

Assistant:

EdgeBool AddEdge(VertType u, VertType v, EdgeProp p)
      {
        EdgeBool e = boost::edge(u, v, *graph_);
        if (u == v)
          return std::make_pair(e.first, false);
        if (e.second)
          return std::make_pair(e.first, false);
        e = boost::add_edge(u, v, p, *graph_);
        edge_idxmap_.insert({e.first, next_edge_id_++});
        return e;
      }